

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_context.h
# Opt level: O0

void __thiscall mocker::SemanticContext::SemanticContext(SemanticContext *this)

{
  SemanticContext *this_local;
  
  this->state = Unused;
  SymTbl::SymTbl(&this->syms);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
  ::unordered_map(&this->exprType);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->leftValue);
  std::
  unordered_map<unsigned_long,_mocker::ScopeID,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>_>
  ::unordered_map(&this->scopeIntroduced);
  std::
  unordered_map<unsigned_long,_mocker::ScopeID,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>_>
  ::unordered_map(&this->scopeResiding);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
  ::unordered_map(&this->associatedDecl);
  return;
}

Assistant:

SemanticContext() = default;